

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int DecompressFiles(Context *context)

{
  int iVar1;
  BrotliDecoderState *state;
  BrotliDecoderState *s;
  int is_ok;
  Context *context_local;
  
  while( true ) {
    iVar1 = NextFile(context);
    if (iVar1 == 0) {
      return 1;
    }
    state = BrotliDecoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    if (state == (BrotliDecoderState *)0x0) break;
    BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,1);
    BrotliDecoderSetParameter(state,BROTLI_DECODER_PARAM_LARGE_WINDOW,0);
    s._4_4_ = OpenFiles(context);
    if ((((s._4_4_ != 0) && (context->current_input_path == (char *)0x0)) &&
        (context->force_overwrite == 0)) && (iVar1 = isatty(0), iVar1 != 0)) {
      fprintf(_stderr,"Use -h help. Use -f to force input from a terminal.\n");
      s._4_4_ = 0;
    }
    if (s._4_4_ != 0) {
      s._4_4_ = DecompressFile(context,state);
    }
    BrotliDecoderDestroyInstance(state);
    iVar1 = CloseFiles(context,s._4_4_);
    if (iVar1 == 0) {
      s._4_4_ = 0;
    }
    if (s._4_4_ == 0) {
      return 0;
    }
  }
  fprintf(_stderr,"out of memory\n");
  return 0;
}

Assistant:

static BROTLI_BOOL DecompressFiles(Context* context) {
  while (NextFile(context)) {
    BROTLI_BOOL is_ok = BROTLI_TRUE;
    BrotliDecoderState* s = BrotliDecoderCreateInstance(NULL, NULL, NULL);
    if (!s) {
      fprintf(stderr, "out of memory\n");
      return BROTLI_FALSE;
    }
    /* This allows decoding "large-window" streams. Though it creates
       fragmentation (new builds decode streams that old builds don't),
       it is better from used experience perspective. */
    BrotliDecoderSetParameter(s, BROTLI_DECODER_PARAM_LARGE_WINDOW, 1u);
    BrotliDecoderSetParameter(s, BROTLI_DECODER_PARAM_LARGE_WINDOW, 0u);
    is_ok = OpenFiles(context);
    if (is_ok && !context->current_input_path &&
        !context->force_overwrite && isatty(STDIN_FILENO)) {
      fprintf(stderr, "Use -h help. Use -f to force input from a terminal.\n");
      is_ok = BROTLI_FALSE;
    }
    if (is_ok) is_ok = DecompressFile(context, s);
    BrotliDecoderDestroyInstance(s);
    if (!CloseFiles(context, is_ok)) is_ok = BROTLI_FALSE;
    if (!is_ok) return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}